

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  undefined1 auVar4 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  size_t itime;
  int iVar11;
  ulong uVar12;
  size_t *psVar13;
  size_t sVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 extraout_var [56];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  undefined1 auVar36 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  float fVar50;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ulong local_130;
  anon_class_16_2_4e716a3c local_128;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar45._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar45._8_56_ = extraout_var;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = time_range->lower;
  auVar24._4_4_ = time_range->upper;
  auVar20 = auVar45._0_16_;
  auVar21 = vcmpps_avx(auVar20,auVar24,1);
  auVar4 = vblendps_avx(auVar24,auVar20,2);
  auVar20 = vinsertps_avx(auVar20,auVar24,0x50);
  auVar4 = vblendvps_avx(auVar20,auVar4,auVar21);
  auVar21 = vmovshdup_avx(auVar4);
  fVar50 = auVar21._0_4_;
  if (auVar4._0_4_ <= fVar50) {
    uVar10 = r->_begin;
    sVar14 = 0;
    auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar52 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar53 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_188._8_4_ = 0xff800000;
    local_188._0_8_ = 0xff800000ff800000;
    local_188._12_4_ = 0xff800000;
    auVar49 = ZEXT1664(local_188);
    local_198._8_4_ = 0x7f800000;
    local_198._0_8_ = 0x7f8000007f800000;
    local_198._12_4_ = 0x7f800000;
    auVar45 = ZEXT1664(local_198);
    while( true ) {
      if (r->_end <= uVar10) break;
      BVar1 = (this->super_LineSegments).super_Geometry.time_range;
      auVar21._8_8_ = 0;
      auVar21._0_4_ = BVar1.lower;
      auVar21._4_4_ = BVar1.upper;
      auVar21 = vmovshdup_avx(auVar21);
      fVar19 = BVar1.lower;
      fVar33 = auVar21._0_4_ - fVar19;
      uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar10);
      uVar9 = (ulong)(uVar2 + 1);
      pBVar3 = (this->super_LineSegments).vertices.items;
      if (uVar9 < (pBVar3->super_RawBufferView).num) {
        fVar17 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar20 = ZEXT416((uint)(fVar17 * ((fVar50 - fVar19) / fVar33) * 0.99999976));
        auVar20 = vroundss_avx(auVar20,auVar20,10);
        auVar24 = vminss_avx(auVar20,ZEXT416((uint)fVar17));
        fVar35 = auVar4._0_4_ - fVar19;
        auVar20 = ZEXT416((uint)(fVar17 * (fVar35 / fVar33) * 1.0000002));
        auVar20 = vroundss_avx(auVar20,auVar20,9);
        auVar20 = vmaxss_avx(auVar51._0_16_,auVar20);
        psVar13 = &pBVar3[(int)auVar20._0_4_].super_RawBufferView.stride;
        uVar12 = (long)(int)auVar20._0_4_ - 1;
LAB_014ff556:
        uVar12 = uVar12 + 1;
        if ((ulong)(long)(int)auVar24._0_4_ < uVar12) {
          fVar16 = auVar21._0_4_ - fVar19;
          fVar35 = fVar35 / fVar16;
          fVar16 = (fVar50 - fVar19) / fVar16;
          fVar33 = fVar17 * fVar35;
          fVar19 = fVar17 * fVar16;
          auVar24 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),9);
          auVar48 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),10);
          auVar21 = vmaxss_avx(auVar24,auVar51._0_16_);
          auVar20 = vminss_avx(auVar48,ZEXT416((uint)fVar17));
          iVar11 = (int)auVar21._0_4_;
          fVar34 = auVar20._0_4_;
          iVar8 = (int)auVar24._0_4_;
          iVar15 = -1;
          if (-1 < iVar8) {
            iVar15 = iVar8;
          }
          local_128.primID = &local_130;
          iVar7 = (int)fVar17 + 1;
          if ((int)auVar48._0_4_ < (int)fVar17 + 1) {
            iVar7 = (int)auVar48._0_4_;
          }
          local_130 = uVar10;
          local_128.this = &this->super_LineSegments;
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower0,&local_128,(long)iVar11);
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper1,&local_128,(long)(int)fVar34);
          fVar33 = fVar33 - auVar21._0_4_;
          if (iVar7 - iVar15 == 1) {
            auVar21 = vmaxss_avx(ZEXT416((uint)fVar33),ZEXT816(0) << 0x40);
            fVar17 = auVar21._0_4_;
            fVar33 = 1.0 - fVar17;
            auVar43._0_4_ = fVar17 * bupper1.lower.field_0._0_4_;
            auVar43._4_4_ = fVar17 * bupper1.lower.field_0._4_4_;
            auVar43._8_4_ = fVar17 * bupper1.lower.field_0._8_4_;
            auVar43._12_4_ = fVar17 * bupper1.lower.field_0._12_4_;
            auVar25._4_4_ = fVar33;
            auVar25._0_4_ = fVar33;
            auVar25._8_4_ = fVar33;
            auVar25._12_4_ = fVar33;
            auVar20 = vfmadd231ps_fma(auVar43,auVar25,(undefined1  [16])blower0.lower.field_0);
            auVar46._0_4_ = fVar17 * bupper1.upper.field_0._0_4_;
            auVar46._4_4_ = fVar17 * bupper1.upper.field_0._4_4_;
            auVar46._8_4_ = fVar17 * bupper1.upper.field_0._8_4_;
            auVar46._12_4_ = fVar17 * bupper1.upper.field_0._12_4_;
            auVar48 = vfmadd231ps_fma(auVar46,(undefined1  [16])blower0.upper.field_0,auVar25);
            auVar21 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar19)),ZEXT816(0) << 0x40);
            fVar19 = auVar21._0_4_;
            fVar33 = 1.0 - fVar19;
            auVar37._0_4_ = fVar19 * blower0.lower.field_0._0_4_;
            auVar37._4_4_ = fVar19 * blower0.lower.field_0._4_4_;
            auVar37._8_4_ = fVar19 * blower0.lower.field_0._8_4_;
            auVar37._12_4_ = fVar19 * blower0.lower.field_0._12_4_;
            auVar26._4_4_ = fVar33;
            auVar26._0_4_ = fVar33;
            auVar26._8_4_ = fVar33;
            auVar26._12_4_ = fVar33;
            auVar39 = vfmadd231ps_fma(auVar37,auVar26,(undefined1  [16])bupper1.lower.field_0);
            auVar29._0_4_ = fVar19 * blower0.upper.field_0._0_4_;
            auVar29._4_4_ = fVar19 * blower0.upper.field_0._4_4_;
            auVar29._8_4_ = fVar19 * blower0.upper.field_0._8_4_;
            auVar29._12_4_ = fVar19 * blower0.upper.field_0._12_4_;
            auVar32 = vfmadd231ps_fma(auVar29,auVar26,(undefined1  [16])bupper1.upper.field_0);
          }
          else {
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&blower1,&local_128,(long)(iVar11 + 1));
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bupper0,&local_128,(long)((int)fVar34 + -1));
            auVar21 = vmaxss_avx(ZEXT416((uint)fVar33),ZEXT816(0) << 0x40);
            fVar18 = auVar21._0_4_;
            fVar33 = 1.0 - fVar18;
            auVar44._0_4_ = fVar18 * blower1.lower.field_0.m128[0];
            auVar44._4_4_ = fVar18 * blower1.lower.field_0.m128[1];
            auVar44._8_4_ = fVar18 * blower1.lower.field_0.m128[2];
            auVar44._12_4_ = fVar18 * blower1.lower.field_0.m128[3];
            auVar27._4_4_ = fVar33;
            auVar27._0_4_ = fVar33;
            auVar27._8_4_ = fVar33;
            auVar27._12_4_ = fVar33;
            auVar20 = vfmadd231ps_fma(auVar44,auVar27,(undefined1  [16])blower0.lower.field_0);
            auVar47._0_4_ = fVar18 * blower1.upper.field_0.m128[0];
            auVar47._4_4_ = fVar18 * blower1.upper.field_0.m128[1];
            auVar47._8_4_ = fVar18 * blower1.upper.field_0.m128[2];
            auVar47._12_4_ = fVar18 * blower1.upper.field_0.m128[3];
            auVar48 = vfmadd231ps_fma(auVar47,auVar27,(undefined1  [16])blower0.upper.field_0);
            auVar21 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar19)),ZEXT816(0) << 0x40);
            fVar19 = auVar21._0_4_;
            auVar38._0_4_ = fVar19 * bupper0.lower.field_0.m128[0];
            auVar38._4_4_ = fVar19 * bupper0.lower.field_0.m128[1];
            auVar38._8_4_ = fVar19 * bupper0.lower.field_0.m128[2];
            auVar38._12_4_ = fVar19 * bupper0.lower.field_0.m128[3];
            fVar33 = 1.0 - fVar19;
            auVar22._4_4_ = fVar33;
            auVar22._0_4_ = fVar33;
            auVar22._8_4_ = fVar33;
            auVar22._12_4_ = fVar33;
            auVar39 = vfmadd231ps_fma(auVar38,auVar22,(undefined1  [16])bupper1.lower.field_0);
            auVar31._0_4_ = fVar19 * bupper0.upper.field_0.m128[0];
            auVar31._4_4_ = fVar19 * bupper0.upper.field_0.m128[1];
            auVar31._8_4_ = fVar19 * bupper0.upper.field_0.m128[2];
            auVar31._12_4_ = fVar19 * bupper0.upper.field_0.m128[3];
            auVar32 = vfmadd231ps_fma(auVar31,auVar22,(undefined1  [16])bupper1.upper.field_0);
            if (iVar8 < 0) {
              iVar8 = -1;
            }
            itime = (size_t)iVar8;
            while (itime = itime + 1, (long)itime < (long)iVar7) {
              fVar19 = ((float)(int)itime / fVar17 - fVar35) / (fVar16 - fVar35);
              fVar33 = 1.0 - fVar19;
              auVar36._0_4_ = auVar39._0_4_ * fVar19;
              fVar40 = auVar39._4_4_;
              auVar36._4_4_ = fVar40 * fVar19;
              fVar41 = auVar39._8_4_;
              auVar36._8_4_ = fVar41 * fVar19;
              fVar42 = auVar39._12_4_;
              auVar36._12_4_ = fVar42 * fVar19;
              auVar28._4_4_ = fVar33;
              auVar28._0_4_ = fVar33;
              auVar28._8_4_ = fVar33;
              auVar28._12_4_ = fVar33;
              auVar21 = vfmadd231ps_fma(auVar36,auVar28,auVar20);
              auVar23._0_4_ = auVar32._0_4_ * fVar19;
              fVar33 = auVar32._4_4_;
              auVar23._4_4_ = fVar33 * fVar19;
              fVar34 = auVar32._8_4_;
              auVar23._8_4_ = fVar34 * fVar19;
              fVar18 = auVar32._12_4_;
              auVar23._12_4_ = fVar18 * fVar19;
              auVar24 = vfmadd231ps_fma(auVar23,auVar48,auVar28);
              LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_128,itime)
              ;
              local_1b8 = auVar48._0_4_;
              fStack_1b4 = auVar48._4_4_;
              fStack_1b0 = auVar48._8_4_;
              fStack_1ac = auVar48._12_4_;
              local_1a8 = auVar20._0_4_;
              fStack_1a4 = auVar20._4_4_;
              fStack_1a0 = auVar20._8_4_;
              fStack_19c = auVar20._12_4_;
              auVar21 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar21);
              auVar20 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar24);
              auVar24 = vminps_avx(auVar21,ZEXT816(0) << 0x40);
              auVar21 = vmaxps_avx(auVar20,ZEXT816(0) << 0x40);
              auVar20._0_4_ = local_1a8 + auVar24._0_4_;
              auVar20._4_4_ = fStack_1a4 + auVar24._4_4_;
              auVar20._8_4_ = fStack_1a0 + auVar24._8_4_;
              auVar20._12_4_ = fStack_19c + auVar24._12_4_;
              auVar39._0_4_ = auVar39._0_4_ + auVar24._0_4_;
              auVar39._4_4_ = fVar40 + auVar24._4_4_;
              auVar39._8_4_ = fVar41 + auVar24._8_4_;
              auVar39._12_4_ = fVar42 + auVar24._12_4_;
              auVar48._0_4_ = local_1b8 + auVar21._0_4_;
              auVar48._4_4_ = fStack_1b4 + auVar21._4_4_;
              auVar48._8_4_ = fStack_1b0 + auVar21._8_4_;
              auVar48._12_4_ = fStack_1ac + auVar21._12_4_;
              auVar32._0_4_ = auVar32._0_4_ + auVar21._0_4_;
              auVar32._4_4_ = fVar33 + auVar21._4_4_;
              auVar32._8_4_ = fVar34 + auVar21._8_4_;
              auVar32._12_4_ = fVar18 + auVar21._12_4_;
            }
          }
          auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar21 = vmaxps_avx(auVar48,auVar32);
          auVar20 = vminps_avx(auVar20,auVar39);
          aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar20,ZEXT416(geomID),0x30);
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar21,ZEXT416((uint)uVar10),0x30);
          local_198 = vminps_avx(local_198,(undefined1  [16])aVar5);
          local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar6);
          auVar30._0_4_ = aVar5.x + aVar6.x;
          auVar30._4_4_ = aVar5.y + aVar6.y;
          auVar30._8_4_ = aVar5.z + aVar6.z;
          auVar30._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
          auVar21 = vminps_avx((undefined1  [16])auVar45._0_16_,auVar30);
          auVar45 = ZEXT1664(auVar21);
          auVar21 = vmaxps_avx((undefined1  [16])auVar49._0_16_,auVar30);
          auVar49 = ZEXT1664(auVar21);
          sVar14 = sVar14 + 1;
          prims[k].lower.field_0.field_1 = aVar5;
          prims[k].upper.field_0.field_1 = aVar6;
          auVar52 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar53 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
        else {
          auVar20 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar13 + -2))->ptr_ofs + *psVar13 * (ulong)uVar2);
          auVar48 = vcmpps_avx(auVar20,auVar52._0_16_,2);
          auVar39 = vcmpps_avx(auVar20,auVar53._0_16_,5);
          auVar48 = vorps_avx(auVar48,auVar39);
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar48[0xf]) {
            auVar48 = *(undefined1 (*) [16])
                       (((RawBufferView *)(psVar13 + -2))->ptr_ofs + *psVar13 * uVar9);
            auVar39 = vcmpps_avx(auVar48,auVar52._0_16_,2);
            auVar32 = vcmpps_avx(auVar48,auVar53._0_16_,5);
            auVar39 = vorps_avx(auVar39,auVar32);
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar39[0xf]) goto code_r0x014ff5aa;
          }
        }
      }
LAB_014ff857:
      uVar10 = uVar10 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_188._8_8_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar45._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar49._0_16_;
    __return_storage_ptr__->end = sVar14;
  }
  return __return_storage_ptr__;
code_r0x014ff5aa:
  psVar13 = psVar13 + 7;
  auVar20 = vshufps_avx(auVar20,auVar20,0xff);
  auVar48 = vshufps_avx(auVar48,auVar48,0xff);
  auVar20 = vminss_avx(auVar20,auVar48);
  if (auVar20._0_4_ < 0.0) goto LAB_014ff857;
  goto LAB_014ff556;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }